

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

void ra_append_copy(roaring_array_t *ra,roaring_array_t *sa,uint16_t index,_Bool copy_on_write)

{
  int iVar1;
  container_t *pcVar2;
  byte in_CL;
  ushort in_DX;
  long in_RSI;
  roaring_array_t *in_RDI;
  int32_t pos;
  
  extend_array(in_RDI,(int32_t)((ulong)in_RSI >> 0x20));
  iVar1 = in_RDI->size;
  in_RDI->keys[iVar1] = *(uint16_t *)(*(long *)(in_RSI + 0x10) + (ulong)in_DX * 2);
  if ((in_CL & 1) == 0) {
    pcVar2 = container_clone(in_RDI,(uint8_t)((ulong)in_RSI >> 0x38));
    in_RDI->containers[iVar1] = pcVar2;
    in_RDI->typecodes[iVar1] = *(uint8_t *)(*(long *)(in_RSI + 0x18) + (ulong)in_DX);
  }
  else {
    pcVar2 = get_copy_of_container
                       (sa,(uint8_t *)CONCAT26(index,CONCAT15(copy_on_write,_pos)),
                        SUB81((ulong)in_RDI >> 0x38,0));
    *(container_t **)(*(long *)(in_RSI + 8) + (ulong)in_DX * 8) = pcVar2;
    in_RDI->containers[iVar1] = *(void **)(*(long *)(in_RSI + 8) + (ulong)in_DX * 8);
    in_RDI->typecodes[iVar1] = *(uint8_t *)(*(long *)(in_RSI + 0x18) + (ulong)in_DX);
  }
  in_RDI->size = in_RDI->size + 1;
  return;
}

Assistant:

void ra_append_copy(roaring_array_t *ra, const roaring_array_t *sa,
                    uint16_t index, bool copy_on_write) {
    extend_array(ra, 1);
    const int32_t pos = ra->size;

    // old contents is junk that does not need freeing
    ra->keys[pos] = sa->keys[index];
    // the shared container will be in two bitmaps
    if (copy_on_write) {
        sa->containers[index] = get_copy_of_container(
            sa->containers[index], &sa->typecodes[index], copy_on_write);
        ra->containers[pos] = sa->containers[index];
        ra->typecodes[pos] = sa->typecodes[index];
    } else {
        ra->containers[pos] =
            container_clone(sa->containers[index], sa->typecodes[index]);
        ra->typecodes[pos] = sa->typecodes[index];
    }
    ra->size++;
}